

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bit.c
# Opt level: O0

sexp_conflict
sexp_bit_ior(sexp_conflict ctx,sexp_conflict self,sexp_sint_t n,sexp_conflict x,sexp_conflict y)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  int iVar4;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  long in_RDI;
  undefined8 in_R8;
  sexp_gc_var_t __sexp_gc_preserver2;
  sexp_conflict tmp;
  sexp_gc_var_t __sexp_gc_preserver1;
  sexp_conflict res;
  sexp_sint_t i;
  sexp_sint_t tmplen;
  sexp_sint_t len;
  ulong local_80;
  sexp_conflict x_00;
  sexp_conflict ctx_00;
  sexp_conflict psVar5;
  undefined8 local_58;
  undefined8 local_50;
  undefined8 local_48;
  undefined8 local_40;
  undefined8 local_38;
  undefined8 in_stack_ffffffffffffffd0;
  undefined8 uVar6;
  
  local_48 = 0x43e;
  memset(&stack0xffffffffffffffa8,0,0x10);
  psVar5 = (sexp_conflict)&DAT_0000043e;
  memset(&stack0xffffffffffffff90,0,0x10);
  if ((in_RCX & 1) == 1) {
    if ((in_R8 & 1) == 1) {
      local_48 = in_RCX | in_R8;
    }
    else if (((in_R8 & 3) == 0) && (((sexp)in_R8)->tag == 0xc)) {
      local_48 = sexp_bit_ior((sexp_conflict)in_RSI,(sexp_conflict)in_RDX,in_RCX,
                              (sexp_conflict)in_R8,(sexp_conflict)in_stack_ffffffffffffffd0);
    }
    else {
      local_48 = sexp_type_exception(in_RDI,in_RSI,2,in_R8);
    }
  }
  else if (((in_RCX & 3) == 0) && (((sexp)in_RCX)->tag == 0xc)) {
    local_58 = &stack0xffffffffffffffb8;
    local_50 = *(undefined8 *)(in_RDI + 0x6080);
    *(undefined8 **)(in_RDI + 0x6080) = &stack0xffffffffffffffa8;
    x_00 = (sexp_conflict)&stack0xffffffffffffffa0;
    ctx_00 = *(sexp_conflict *)(in_RDI + 0x6080);
    *(undefined1 **)(in_RDI + 0x6080) = &stack0xffffffffffffff90;
    if (((in_R8 & 1) == 1) &&
       (auVar1._8_8_ = (long)in_R8 >> 0x3f, auVar1._0_8_ = in_R8 & 0xfffffffffffffffe,
       -1 < SUB168(auVar1 / SEXT816(2),0))) {
      local_48 = sexp_copy_bignum(in_RDI,0,in_RCX);
      if ((((sexp_conflict)local_48)->value).flonum_bits[0] < '\0') {
        sexp_set_twos_complement((sexp_conflict)local_48);
      }
      auVar2._8_8_ = (long)in_R8 >> 0x3f;
      auVar2._0_8_ = in_R8 & 0xfffffffffffffffe;
      (((sexp)local_48)->value).string.length =
           SUB168(auVar2 / SEXT816(2),0) | (((sexp)local_48)->value).string.length;
      if ((((sexp)local_48)->value).flonum_bits[0] < '\0') {
        sexp_set_twos_complement((sexp_conflict)local_48);
      }
    }
    else if ((((in_R8 & 3) == 0) && (((sexp)in_R8)->tag == 0xc)) || ((in_R8 & 1) == 1)) {
      if (((in_R8 & 1) == 1) ||
         ((((sexp)in_R8)->value).type.cpl <= (((sexp)in_RCX)->value).type.cpl)) {
        local_48 = sexp_copy_bignum(in_RDI,0,in_RCX);
        uVar6 = (((sexp_conflict)local_48)->value).type.cpl;
        if ((in_R8 & 1) == 1) {
          psVar5 = sexp_fixnum_to_twos_complement(psVar5,ctx_00,(int)((ulong)x_00 >> 0x20));
        }
        else {
          psVar5 = sexp_twos_complement(ctx_00,x_00);
        }
      }
      else {
        local_48 = sexp_copy_bignum(in_RDI,0,in_R8);
        uVar6 = (((sexp_conflict)local_48)->value).type.cpl;
        psVar5 = sexp_twos_complement(ctx_00,x_00);
      }
      if ((((sexp)local_48)->value).flonum_bits[0] < '\0') {
        sexp_set_twos_complement((sexp_conflict)local_48);
      }
      local_38 = (psVar5->value).fileno.fd;
      for (local_40 = (sexp)0x0; (long)local_40 < (long)uVar6;
          local_40 = (long)&((sexp)local_40)->tag + 1) {
        if ((long)local_40 < (long)local_38) {
          local_80 = *(ulong *)((long)&psVar5->value + local_40 * 8 + 0x10);
        }
        else {
          iVar4 = 0;
          if ((psVar5->value).flonum_bits[0] < '\0') {
            iVar4 = -1;
          }
          local_80 = (ulong)iVar4;
        }
        *(ulong *)((long)&((sexp)local_48)->value + local_40 * 8 + 0x10) =
             local_80 | *(ulong *)((long)&((sexp)local_48)->value + local_40 * 8 + 0x10);
      }
      if (((((((sexp)local_48)->value).flonum_bits[0] < '\0') ||
           ((psVar5->value).flonum_bits[0] < '\0')) &&
          (*(long *)((long)&((sexp_conflict)(local_48 + 0x2a578))->value +
                    (long)&((sexp)(uVar6 + -0x60c8))->value * 8 + 0x6090) < 0)) &&
         (sexp_set_twos_complement((sexp_conflict)local_48),
         '\0' < (((sexp)local_48)->value).flonum_bits[0])) {
        if (((local_48 & 3) == 0) && (((sexp)local_48)->tag == 0xc)) {
          (((sexp)local_48)->value).flonum_bits[0] = -(((sexp)local_48)->value).flonum_bits[0];
        }
        else if ((local_48 & 1) == 1) {
          auVar3._8_8_ = (long)local_48 >> 0x3f;
          auVar3._0_8_ = local_48 & 0xfffffffffffffffe;
          local_48 = SUB168(auVar3 / SEXT816(2),0) * -2 | 1;
        }
      }
    }
    else {
      local_48 = sexp_type_exception(in_RDI,in_RSI,2,in_R8);
    }
    *(undefined8 *)(in_RDI + 0x6080) = local_50;
  }
  else {
    local_48 = sexp_type_exception(in_RDI,in_RSI,2,in_RCX);
  }
  psVar5 = (sexp_conflict)sexp_bignum_normalize(local_48);
  return psVar5;
}

Assistant:

sexp sexp_bit_ior (sexp ctx, sexp self, sexp_sint_t n, sexp x, sexp y) {
#if SEXP_USE_BIGNUMS
  sexp_sint_t len, tmplen, i;
#endif
  sexp_gc_var2(res, tmp);
  if (sexp_fixnump(x)) {
    if (sexp_fixnump(y))
      res = (sexp) ((sexp_uint_t)x | (sexp_uint_t)y);
#if SEXP_USE_BIGNUMS
    else if (sexp_bignump(y))
      res = sexp_bit_ior(ctx, self, n, y, x);
#endif
    else
      res = sexp_type_exception(ctx, self, SEXP_FIXNUM, y);
#if SEXP_USE_BIGNUMS
  } else if (sexp_bignump(x)) {
    sexp_gc_preserve2(ctx, res, tmp);
    if (sexp_fixnump(y) && sexp_unbox_fixnum(y) >= 0) {
      res = sexp_copy_bignum(ctx, NULL, x, 0);
      if (sexp_bignum_sign(res) < 0)
        sexp_set_twos_complement(res);
      sexp_bignum_data(res)[0] |= (sexp_uint_t)sexp_unbox_fixnum(y);
      if (sexp_bignum_sign(res) < 0)
        sexp_set_twos_complement(res);
    } else if (sexp_bignump(y) || sexp_fixnump(y)) {
      if (sexp_fixnump(y) || sexp_bignum_length(x) >= sexp_bignum_length(y)) {
        res = sexp_copy_bignum(ctx, NULL, x, 0);
        len = sexp_bignum_length(res);
        tmp = sexp_fixnump(y) ? sexp_fixnum_to_twos_complement(ctx, y, len) : sexp_twos_complement(ctx, y);
      } else {
        res = sexp_copy_bignum(ctx, NULL, y, 0);
        len = sexp_bignum_length(res);
        tmp = sexp_twos_complement(ctx, x);
      }
      if (sexp_bignum_sign(res) < 0)
        sexp_set_twos_complement(res);
      tmplen = sexp_bignum_length(tmp);
      for (i=0; i<len; i++)
        sexp_bignum_data(res)[i] |= (i<tmplen ? sexp_bignum_data(tmp)[i] : sexp_bignum_sign(tmp) < 0 ? -1 : 0);
      if ((sexp_bignum_sign(res) < 0 || sexp_bignum_sign(tmp) < 0) && ((sexp_sint_t)(sexp_bignum_data(res)[len-1])) < 0) {
        sexp_set_twos_complement(res);
        if (sexp_bignum_sign(res) > 0) {
          sexp_negate_exact(res);
        }
      }
    } else {
      res = sexp_type_exception(ctx, self, SEXP_FIXNUM, y);
    }
    sexp_gc_release2(ctx);
#endif
  } else {
    res = sexp_type_exception(ctx, self, SEXP_FIXNUM, x);
  }
  return sexp_bignum_normalize(res);
}